

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_effect.cpp
# Opt level: O2

void P_DrawRailTrail(AActor *source,TArray<SPortalHit,_SPortalHit> *portalhits,int color1,int color2
                    ,double maxdiff,int flags,PClassActor *spawnclass,DAngle angle,int duration,
                    double sparsity,double drift,int SpiralOffset,DAngle pitch)

{
  SPortalHit *pSVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  byte bVar5;
  int iVar6;
  uint uVar7;
  uint32 uVar8;
  AActor *pAVar9;
  AWeapon *pAVar10;
  TrailSegment *pTVar11;
  particle_t *ppVar12;
  int iVar13;
  TrailSegment *pTVar14;
  long lVar15;
  TArray<TrailSegment,_TrailSegment> *__range4;
  int iVar16;
  ulong uVar17;
  int iVar18;
  bool bVar19;
  double dVar20;
  double dVar21;
  double in_XMM0_Qb;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  double dVar25;
  double dVar26;
  double dVar27;
  undefined4 in_stack_0000000c;
  int in_stack_00000018;
  double *in_stack_00000020;
  TArray<TrailSegment,_TrailSegment> trail;
  undefined1 local_1f8 [16];
  double local_1e8;
  double local_1d8;
  double dStack_1d0;
  double local_1c8;
  double dStack_1c0;
  undefined4 uStack_1a0;
  uint uStack_19c;
  double local_198;
  undefined8 uStack_190;
  double local_178;
  double dStack_170;
  double local_168;
  ulong uStack_160;
  TVector3<double> local_138;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  double local_f8;
  double dStack_f0;
  double local_e8;
  TAngle<double> local_d8;
  FSoundID local_d0;
  FSoundID local_cc;
  TrailSegment local_c8;
  undefined1 local_58 [16];
  double local_48;
  double dStack_40;
  
  local_108._0_4_ = color2;
  trail.Array = (TrailSegment *)0x0;
  trail.Most = 0;
  trail.Count = 0;
  uVar17 = 0;
  dVar21 = 0.0;
  local_e8 = angle.Degrees;
  while (uVar17 < portalhits->Count - 1) {
    pSVar1 = portalhits->Array;
    local_c8.start.Z = pSVar1[uVar17].ContPos.Z;
    local_c8.start.X = pSVar1[uVar17].ContPos.X;
    local_c8.start.Y = pSVar1[uVar17].ContPos.Y;
    local_c8.dir.Z = pSVar1[uVar17].OutDir.Z;
    local_c8.dir.X = pSVar1[uVar17].OutDir.X;
    local_c8.dir.Y = pSVar1[uVar17].OutDir.Y;
    local_138.Z = pSVar1[uVar17 + 1].HitPos.Z - local_c8.start.Z;
    local_138.X = pSVar1[uVar17 + 1].HitPos.X - local_c8.start.X;
    local_138.Y = pSVar1[uVar17 + 1].HitPos.Y - local_c8.start.Y;
    dVar20 = TVector3<double>::Length(&local_138);
    uVar17 = uVar17 + 1;
    dVar27 = 1.0;
    iVar18 = 0;
    for (iVar13 = 0; iVar13 != 3; iVar13 = iVar13 + 1) {
      lVar15 = 0;
      if (iVar13 != 0) {
        lVar15 = (ulong)(iVar13 != 1) * 8 + 8;
      }
      dVar22 = ABS(*(double *)((long)&local_c8.dir.X + lVar15));
      iVar6 = iVar13;
      if (dVar27 <= dVar22) {
        dVar22 = dVar27;
        iVar6 = iVar18;
      }
      dVar27 = dVar22;
      iVar18 = iVar6;
    }
    lVar15 = 0;
    if (iVar18 != 0) {
      lVar15 = (ulong)(iVar18 != 1) * 8 + 8;
    }
    local_138.X = 0.0;
    local_138.Y = 0.0;
    local_138.Z = 0.0;
    *(undefined8 *)((long)&local_138.X + lVar15) = 0x3ff0000000000000;
    dVar27 = local_c8.dir.Y * local_138.Y + local_c8.dir.X * local_138.X +
             local_c8.dir.Z * local_138.Z;
    local_c8.extend.X = (local_138.X - dVar27 * local_c8.dir.X) * 3.0;
    local_c8.extend.Y = (local_138.Y - dVar27 * local_c8.dir.Y) * 3.0;
    local_c8.extend.Z = (local_138.Z - local_c8.dir.Z * dVar27) * 3.0;
    local_c8.length = dVar20;
    pAVar9 = GC::ReadBarrier<AActor>((AActor **)(&DAT_009ba598 + (long)consoleplayer * 0x54));
    in_XMM2_Dc = SUB84(local_c8.dir.Y,0);
    in_XMM2_Dd = (undefined4)((ulong)local_c8.dir.Y >> 0x20);
    dVar27 = (pAVar9->__Pos).X;
    dVar22 = (pAVar9->__Pos).Y;
    dVar25 = (-local_c8.dir.Y * (local_c8.start.Y - dVar22) -
             local_c8.dir.X * (local_c8.start.X - dVar27)) / (local_c8.length * local_c8.length);
    dVar26 = 1.0;
    if (dVar25 <= 1.0) {
      dVar26 = dVar25;
    }
    dVar26 = (double)(-(ulong)(0.0 < dVar25) & (ulong)dVar26);
    local_c8.soundpos.X = dVar26 * local_c8.dir.X + local_c8.start.X;
    local_c8.soundpos.Y = dVar26 * local_c8.dir.Y + local_c8.start.Y;
    dVar27 = local_c8.soundpos.X - dVar27;
    dVar22 = local_c8.soundpos.Y - dVar22;
    local_c8.sounddist = dVar22 * dVar22 + dVar27 * dVar27;
    TArray<TrailSegment,_TrailSegment>::Push(&trail,&local_c8);
    dVar21 = dVar21 + dVar20;
  }
  iVar18 = SUB84(dVar21 / 3.0 + -0.499999985 + 6755399441055744.0,0);
  if (iVar18 == 0) goto LAB_00492814;
  iVar13 = local_108._0_4_;
  if ((flags & 1U) == 0) {
    pAVar10 = (AWeapon *)source;
    if ((source->player == (player_t *)0x0) ||
       (pAVar10 = source->player->ReadyWeapon, pAVar10 != (AWeapon *)0x0)) {
      iVar6 = (pAVar10->super_AInventory).super_AActor.AttackSound.super_FSoundID.ID;
    }
    else {
      iVar6 = S_FindSound((char *)0x0);
    }
    if (iVar6 == 0) {
      iVar6 = S_FindSound("weapons/railgf");
    }
    pAVar9 = GC::ReadBarrier<AActor>((AActor **)(&DAT_009ba598 + (long)consoleplayer * 0x54));
    if ((20.0 <= ABS((pAVar9->__Pos).X - ((trail.Array)->start).X)) ||
       (20.0 <= ABS((pAVar9->__Pos).Y - ((trail.Array)->start).Y))) {
      pTVar11 = (TrailSegment *)0x0;
      pTVar14 = trail.Array;
      for (lVar15 = ((ulong)trail._8_8_ >> 0x20) * 0x68; lVar15 != 0; lVar15 = lVar15 + -0x68) {
        if ((pTVar11 == (TrailSegment *)0x0) ||
           (pTVar14->sounddist <= pTVar11->sounddist && pTVar11->sounddist != pTVar14->sounddist)) {
          pTVar11 = pTVar14;
        }
        pTVar14 = pTVar14 + 1;
      }
      local_c8.start.X = (pTVar11->soundpos).X;
      local_c8.start.Y = (pTVar11->soundpos).Y;
      local_c8.start.Z = ViewPos.Z;
      local_d0.ID = iVar6;
      S_Sound(&local_c8.start,1,&local_d0,1.0,1.0);
    }
    else {
      local_cc.ID = iVar6;
      S_Sound(pAVar9,1,&local_cc,1.0,1.0);
    }
  }
  iVar6 = r_rail_spiralsparsity.Value;
  bVar5 = (byte)flags >> 3 & 1;
  if (color1 == -1) {
    color1 = 0xffffffff;
LAB_0049207f:
    if (iVar13 != -1) goto LAB_00492085;
  }
  else {
    if ((iVar13 == -1) || (r_rail_smartspiral.Value == false)) {
      if (spawnclass == (PClassActor *)0x0 && 0 < r_rail_spiralsparsity.Value) {
        local_1f8._0_8_ = (trail.Array)->length;
        if (color1 == 0) {
          color1 = 0xffffffff;
        }
        else {
          color1 = ParticleColor(color1);
        }
        dVar21 = (double)(iVar6 * 3) * local_e8;
        iVar6 = (int)((double)(iVar6 * iVar18) / local_e8);
        local_1c8 = ((trail.Array)->start).Z;
        local_1d8 = ((trail.Array)->start).X;
        dStack_1d0 = ((trail.Array)->start).Y;
        local_1e8 = (double)in_stack_00000018;
        iVar13 = 0x23;
        if (SpiralOffset != 0) {
          iVar13 = SpiralOffset;
        }
        local_118._8_4_ = in_XMM2_Dc;
        local_118._0_8_ = dVar21;
        local_118._12_4_ = in_XMM2_Dd;
        local_58._8_4_ = SUB84(dVar21,0);
        local_58._0_8_ = dVar21;
        local_58._12_4_ = (int)((ulong)dVar21 >> 0x20);
        uVar17 = 0;
        local_48 = sparsity;
        dStack_40 = sparsity;
        while (bVar19 = iVar6 != 0, iVar6 = iVar6 + -1, bVar19) {
          ppVar12 = NewParticle();
          if (ppVar12 == (particle_t *)0x0) goto LAB_00492814;
          ppVar12->trans = 0xff;
          ppVar12->ttl = (BYTE)SpiralOffset;
          ppVar12->fade = (BYTE)(0xff / (long)iVar13);
          ppVar12->size = 3.0;
          ppVar12->bright = bVar5;
          local_d8.Degrees = local_1e8;
          TMatrix3x3<double>::TMatrix3x3
                    ((TMatrix3x3<double> *)&local_c8,&trail.Array[uVar17].dir,&local_d8);
          operator*(&local_138,(TMatrix3x3<double> *)&local_c8,&trail.Array[uVar17].extend);
          (ppVar12->Vel).Z = local_138.Z * sparsity * 0.0625;
          dVar21 = local_138.X * local_48 * 0.0625;
          dVar27 = local_138.Y * dStack_40 * 0.0625;
          auVar2._8_4_ = SUB84(dVar27,0);
          auVar2._0_8_ = dVar21;
          auVar2._12_4_ = (int)((ulong)dVar27 >> 0x20);
          (ppVar12->Vel).X = dVar21;
          (ppVar12->Vel).Y = (double)auVar2._8_8_;
          (ppVar12->Pos).Z = local_138.Z + local_1c8;
          (ppVar12->Pos).X = local_1d8 + local_138.X;
          (ppVar12->Pos).Y = dStack_1d0 + local_138.Y;
          iVar16 = r_rail_spiralsparsity.Value * 0xe;
          local_f8 = trail.Array[uVar17].dir.X;
          dStack_f0 = trail.Array[uVar17].dir.Y;
          dVar21 = trail.Array[uVar17].dir.Z * (double)local_118._0_8_;
          uVar8 = color1;
          if ((((color1 == 0xffffffff) &&
               (uVar7 = FRandom::operator()(&M_Random), uVar8 = rblue2, 0x9a < (int)uVar7)) &&
              (uVar8 = rblue1, 0xbb < uVar7)) && (uVar8 = rblue4, uVar7 < 0xde)) {
            uVar8 = rblue3;
          }
          ppVar12->color = uVar8;
          local_1f8._0_8_ = (double)local_1f8._0_8_ - (double)local_118._0_8_;
          if ((double)local_1f8._0_8_ <= 0.0) {
            uVar7 = (int)uVar17 + 1;
            uVar17 = (ulong)uVar7;
            if (trail.Count <= uVar7) break;
            local_1d8 = trail.Array[uVar7].start.X -
                        (double)local_1f8._0_8_ * trail.Array[uVar7].dir.X;
            dStack_1d0 = trail.Array[uVar7].start.Y -
                         (double)local_1f8._0_8_ * trail.Array[uVar7].dir.Y;
            local_1c8 = trail.Array[uVar7].start.Z -
                        trail.Array[uVar7].dir.Z * (double)local_1f8._0_8_;
            local_1f8._0_8_ = (double)local_1f8._0_8_ + trail.Array[uVar7].length;
          }
          else {
            local_1d8 = local_1d8 + local_f8 * (double)local_58._0_8_;
            dStack_1d0 = dStack_1d0 + dStack_f0 * (double)local_58._8_8_;
            local_1c8 = local_1c8 + dVar21;
          }
          local_1e8 = local_1e8 + (double)iVar16;
        }
        iVar13 = local_108._0_4_;
      }
      goto LAB_0049207f;
    }
LAB_00492085:
    iVar6 = r_rail_trailsparsity.Value;
    if (spawnclass == (PClassActor *)0x0 && 0 < r_rail_trailsparsity.Value) {
      iVar16 = r_rail_spiralsparsity.Value * 3;
      if (iVar13 == 0) {
        uVar8 = 0xffffffff;
      }
      else {
        uVar8 = ParticleColor(iVar13);
      }
      dVar27 = (double)(iVar6 * iVar18) / local_e8 + -0.499999985 + 6755399441055744.0;
      dVar21 = (double)iVar16 * local_e8;
      local_1d8 = ((trail.Array)->start).Z;
      local_1f8._0_8_ = ((trail.Array)->start).X;
      local_1f8._8_8_ = ((trail.Array)->start).Y;
      local_1e8 = (trail.Array)->length;
      iVar18 = 0x21;
      if (SpiralOffset != 0) {
        iVar18 = SpiralOffset;
      }
      local_f8 = -maxdiff;
      dStack_f0 = -in_XMM0_Qb;
      local_108._8_4_ = SUB84(dVar21,0);
      local_108._0_8_ = dVar21;
      local_108._12_4_ = (int)((ulong)dVar21 >> 0x20);
      local_1c8 = 0.0;
      dStack_1c0 = 0.0;
      uVar17 = 0;
      local_168 = 0.0;
      uStack_160 = 0;
      while ((iVar13 = SUB84(dVar27,0), dVar27 = (double)(ulong)(iVar13 - 1), iVar13 != 0 &&
             (ppVar12 = JitterParticle(iVar18,(double)(float)sparsity), ppVar12 != (particle_t *)0x0
             ))) {
        if (0.0 < maxdiff) {
          uVar7 = FRandom::operator()(&M_Random);
          if ((uVar7 & 1) != 0) {
            local_1c8 = (double)(int)(-(uint)((uVar7 & 8) == 0) | 1) + local_1c8;
            local_1c8 = (double)(~-(ulong)(local_f8 < local_1c8) & (ulong)local_f8 |
                                (-(ulong)(maxdiff <= local_1c8) & (ulong)maxdiff |
                                ~-(ulong)(maxdiff <= local_1c8) & (ulong)local_1c8) &
                                -(ulong)(local_f8 < local_1c8));
          }
          if ((uVar7 & 2) != 0) {
            dStack_1c0 = dStack_1c0 + (double)(int)(-(uint)((uVar7 & 0x10) == 0) | 1);
            dStack_1c0 = (double)(~-(ulong)(local_f8 < dStack_1c0) & (ulong)local_f8 |
                                 (-(ulong)(maxdiff <= dStack_1c0) & (ulong)maxdiff |
                                 ~-(ulong)(maxdiff <= dStack_1c0) & (ulong)dStack_1c0) &
                                 -(ulong)(local_f8 < dStack_1c0));
          }
          if ((uVar7 & 4) != 0) {
            local_168 = local_168 + (double)(int)(-(uint)((uVar7 & 0x20) == 0) | 1);
            auVar24._0_8_ = -(ulong)(maxdiff <= local_168) & (ulong)maxdiff;
            auVar24._8_8_ = in_XMM0_Qb;
            auVar3._8_4_ = (int)(~(ulong)in_XMM0_Qb & uStack_160);
            auVar3._0_8_ = ~-(ulong)(maxdiff <= local_168) & (ulong)local_168;
            auVar3._12_4_ = (int)((~(ulong)in_XMM0_Qb & uStack_160) >> 0x20);
            local_168 = (double)(~-(ulong)(local_f8 < local_168) & (ulong)local_f8 |
                                SUB168(auVar24 | auVar3,0) & -(ulong)(local_f8 < local_168));
            uStack_160 = ~uStack_160 & (ulong)dStack_f0 | SUB168(auVar24 | auVar3,8) & uStack_160;
          }
        }
        ppVar12->size = 2.0;
        (ppVar12->Pos).Z = local_1d8 + local_168;
        (ppVar12->Pos).X = (double)local_1f8._0_8_ + local_1c8;
        (ppVar12->Pos).Y = (double)local_1f8._8_8_ + dStack_1c0;
        if (color1 != 0xffffffff) {
          (ppVar12->Acc).Z = (ppVar12->Acc).Z + -0.000244140625;
        }
        local_118._0_8_ = trail.Array[uVar17].dir.X;
        local_118._8_8_ = trail.Array[uVar17].dir.Y;
        dVar20 = trail.Array[uVar17].dir.Z;
        ppVar12->bright = bVar5;
        if (uVar8 == 0xffffffff) {
          uVar7 = FRandom::operator()(&M_Random);
          iVar13 = grey4;
          if ((0x54 < (int)uVar7) && (iVar13 = grey1, uVar7 < 0xaa)) {
            iVar13 = grey2;
          }
          ppVar12->color = iVar13;
        }
        else {
          ppVar12->color = uVar8;
        }
        local_1e8 = local_1e8 - dVar21;
        if (local_1e8 <= 0.0) {
          uVar7 = (int)uVar17 + 1;
          uVar17 = (ulong)uVar7;
          if (trail.Count <= uVar7) break;
          local_1f8._8_8_ = trail.Array[uVar7].start.Y - local_1e8 * trail.Array[uVar7].dir.Y;
          local_1f8._0_8_ = trail.Array[uVar7].start.X - local_1e8 * trail.Array[uVar7].dir.X;
          local_1d8 = trail.Array[uVar7].start.Z - trail.Array[uVar7].dir.Z * local_1e8;
          local_1e8 = local_1e8 + trail.Array[uVar7].length;
        }
        else {
          local_1f8._8_8_ =
               (double)local_1f8._8_8_ + (double)local_118._8_8_ * (double)local_108._8_8_;
          local_1f8._0_8_ =
               (double)local_1f8._0_8_ + (double)local_118._0_8_ * (double)local_108._0_8_;
          local_1d8 = local_1d8 + dVar20 * dVar21;
        }
      }
      goto LAB_00492814;
    }
  }
  if (spawnclass != (PClassActor *)0x0) {
    dVar21 = (double)(~-(ulong)(local_e8 < 1.0) & (ulong)local_e8 |
                     -(ulong)(local_e8 < 1.0) & 0x4040000000000000);
    iVar18 = (int)((double)(iVar18 * 3) / dVar21);
    dVar21 = (double)(r_rail_spiralsparsity.Value * 3) * dVar21;
    local_1d8 = ((trail.Array)->start).Z;
    local_1f8._0_8_ = ((trail.Array)->start).X;
    local_1f8._8_8_ = ((trail.Array)->start).Y;
    local_1e8 = (trail.Array)->length;
    uStack_1a0 = SUB84(in_XMM0_Qb,0);
    uStack_19c = (uint)((ulong)in_XMM0_Qb >> 0x20);
    local_198 = -maxdiff;
    uStack_190._0_4_ = uStack_1a0;
    uStack_190._4_4_ = uStack_19c ^ 0x80000000;
    local_118._8_8_ = dVar21;
    local_118._0_8_ = dVar21;
    local_178 = 0.0;
    dStack_170 = 0.0;
    uVar17 = 0;
    local_1c8 = 0.0;
    dStack_1c0 = 0.0;
    while (bVar19 = iVar18 != 0, iVar18 = iVar18 + -1, bVar19) {
      if (0.0 < maxdiff) {
        uVar7 = FRandom::operator()(&pr_railtrail);
        if ((uVar7 & 1) != 0) {
          local_178 = (double)(int)(-(uint)((uVar7 & 8) == 0) | 1) + local_178;
          local_178 = (double)(~-(ulong)(local_198 < local_178) & (ulong)local_198 |
                              (-(ulong)(maxdiff <= local_178) & (ulong)maxdiff |
                              ~-(ulong)(maxdiff <= local_178) & (ulong)local_178) &
                              -(ulong)(local_198 < local_178));
        }
        if ((uVar7 & 2) != 0) {
          dStack_170 = dStack_170 + (double)(int)(-(uint)((uVar7 & 0x10) == 0) | 1);
          dStack_170 = (double)(~-(ulong)(local_198 < dStack_170) & (ulong)local_198 |
                               (-(ulong)(maxdiff <= dStack_170) & (ulong)maxdiff |
                               ~-(ulong)(maxdiff <= dStack_170) & (ulong)dStack_170) &
                               -(ulong)(local_198 < dStack_170));
        }
        if ((uVar7 & 4) != 0) {
          local_1c8 = local_1c8 + (double)(int)(-(uint)((uVar7 & 0x20) == 0) | 1);
          auVar23._0_8_ = -(ulong)(maxdiff <= local_1c8) & (ulong)maxdiff;
          auVar23._8_8_ = in_XMM0_Qb;
          auVar4._8_4_ = (int)(~(ulong)in_XMM0_Qb & (ulong)dStack_1c0);
          auVar4._0_8_ = ~-(ulong)(maxdiff <= local_1c8) & (ulong)local_1c8;
          auVar4._12_4_ = (int)((~(ulong)in_XMM0_Qb & (ulong)dStack_1c0) >> 0x20);
          local_1c8 = (double)(~-(ulong)(local_198 < local_1c8) & (ulong)local_198 |
                              SUB168(auVar23 | auVar4,0) & -(ulong)(local_198 < local_1c8));
          dStack_1c0 = (double)(~(ulong)dStack_1c0 & uStack_190 |
                               SUB168(auVar23 | auVar4,8) & (ulong)dStack_1c0);
        }
      }
      local_c8.start.X = (double)local_1f8._0_8_ + local_178;
      local_c8.start.Y = (double)local_1f8._8_8_ + dStack_170;
      local_c8.start.Z = local_1d8 + local_1c8;
      pAVar9 = Spawn(spawnclass,&local_c8.start,ALLOW_REPLACE);
      if (pAVar9 != (AActor *)0x0) {
        if (source != (AActor *)0x0) {
          (pAVar9->target).field_0.p = source;
        }
        (pAVar9->Angles).Pitch.Degrees = *in_stack_00000020;
        (pAVar9->Angles).Yaw.Degrees = *(double *)CONCAT44(in_stack_0000000c,duration);
      }
      local_1e8 = local_1e8 - dVar21;
      if (local_1e8 <= 0.0) {
        uVar7 = (int)uVar17 + 1;
        uVar17 = (ulong)uVar7;
        if (trail.Count <= uVar7) break;
        local_1f8._8_8_ = trail.Array[uVar7].start.Y - local_1e8 * trail.Array[uVar7].dir.Y;
        local_1f8._0_8_ = trail.Array[uVar7].start.X - local_1e8 * trail.Array[uVar7].dir.X;
        local_1d8 = trail.Array[uVar7].start.Z - trail.Array[uVar7].dir.Z * local_1e8;
        local_1e8 = local_1e8 + trail.Array[uVar7].length;
      }
      else {
        dVar27 = (double)local_1f8._8_8_ + trail.Array[uVar17].dir.Y * (double)local_118._8_8_;
        local_1f8._8_4_ = SUB84(dVar27,0);
        local_1f8._0_8_ =
             (double)local_1f8._0_8_ + trail.Array[uVar17].dir.X * (double)local_118._0_8_;
        local_1f8._12_4_ = (int)((ulong)dVar27 >> 0x20);
        local_1d8 = local_1d8 + trail.Array[uVar17].dir.Z * dVar21;
      }
    }
  }
LAB_00492814:
  TArray<TrailSegment,_TrailSegment>::~TArray(&trail);
  return;
}

Assistant:

void P_DrawRailTrail(AActor *source, TArray<SPortalHit> &portalhits, int color1, int color2, double maxdiff, int flags, PClassActor *spawnclass, DAngle angle, int duration, double sparsity, double drift, int SpiralOffset, DAngle pitch)
{
	double length = 0;
	int steps, i;
	TArray<TrailSegment> trail;
	TAngle<double> deg;
	DVector3 pos;
	bool fullbright;
	unsigned segment;
	double lencount;

	for (unsigned i = 0; i < portalhits.Size() - 1; i++)
	{
		TrailSegment seg;

		seg.start = portalhits[i].ContPos;
		seg.dir = portalhits[i].OutDir;
		seg.length = (portalhits[i + 1].HitPos - seg.start).Length();

		//Calculate PerpendicularVector (extend, dir):
		double minelem = 1;
		int epos;
		int ii;
		for (epos = 0, ii = 0; ii < 3; ++ii)
		{
			if (fabs(seg.dir[ii]) < minelem)
			{
				epos = ii;
				minelem = fabs(seg.dir[ii]);
			}
		}
		DVector3 tempvec(0, 0, 0);
		tempvec[epos] = 1;
		seg.extend = (tempvec - (seg.dir | tempvec) * seg.dir) * 3;
		length += seg.length;

		// Only consider sound in 2D (for now, anyway)
		// [BB] You have to divide by lengthsquared here, not multiply with it.
		AActor *mo = players[consoleplayer].camera;

		double r = ((seg.start.Y - mo->Y()) * (-seg.dir.Y) - (seg.start.X - mo->X()) * (seg.dir.X)) / (seg.length * seg.length);
		r = clamp<double>(r, 0., 1.);
		seg.soundpos = seg.start + r * seg.dir;
		seg.sounddist = (seg.soundpos - mo->Pos()).LengthSquared();
		trail.Push(seg);
	}

	steps = xs_FloorToInt(length / 3);
	fullbright = !!(flags & RAF_FULLBRIGHT);

	if (steps)
	{
		if (!(flags & RAF_SILENT))
		{
			FSoundID sound;
			
			// Allow other sounds than 'weapons/railgf'!
			if (!source->player) sound = source->AttackSound;
			else if (source->player->ReadyWeapon) sound = source->player->ReadyWeapon->AttackSound;
			else sound = 0;
			if (!sound) sound = "weapons/railgf";

			// The railgun's sound is special. It gets played from the
			// point on the slug's trail that is closest to the hearing player.
			AActor *mo = players[consoleplayer].camera;

			if (fabs(mo->X() - trail[0].start.X) < 20 && fabs(mo->Y() - trail[0].start.Y) < 20)
			{ // This player (probably) fired the railgun
				S_Sound (mo, CHAN_WEAPON, sound, 1, ATTN_NORM);
			}
			else
			{
				TrailSegment *shortest = NULL;
				for (auto &seg : trail)
				{
					if (shortest == NULL || shortest->sounddist > seg.sounddist) shortest = &seg;
				}
				S_Sound (DVector3(shortest->soundpos, ViewPos.Z), CHAN_WEAPON, sound, 1, ATTN_NORM);
			}
		}
	}
	else
	{
		// line is 0 length, so nothing to do
		return;
	}

	// Create the outer spiral.
	if (color1 != -1 && (!r_rail_smartspiral || color2 == -1) && r_rail_spiralsparsity > 0 && (spawnclass == NULL))
	{
		double stepsize = 3 * r_rail_spiralsparsity * sparsity;
		int spiral_steps = (int)(steps * r_rail_spiralsparsity / sparsity);
		segment = 0;
		lencount = trail[0].length;
		
		color1 = color1 == 0 ? -1 : ParticleColor(color1);
		pos = trail[0].start;
		deg = (double)SpiralOffset;
		for (i = spiral_steps; i; i--)
		{
			particle_t *p = NewParticle ();
			DVector3 tempvec;

			if (!p)
				return;

			int spiralduration = (duration == 0) ? 35 : duration;

			p->trans = 255;
			p->ttl = duration;
			p->fade = FADEFROMTTL(spiralduration);
			p->size = 3;
			p->bright = fullbright;

			tempvec = DMatrix3x3(trail[segment].dir, deg) * trail[segment].extend;
			p->Vel = tempvec * drift / 16.;
			p->Pos = tempvec + pos;
			pos += trail[segment].dir * stepsize;
			deg += double(r_rail_spiralsparsity * 14);
			lencount -= stepsize;
			if (color1 == -1)
			{
				int rand = M_Random();

				if (rand < 155)
					p->color = rblue2;
				else if (rand < 188)
					p->color = rblue1;
				else if (rand < 222)
					p->color = rblue3;
				else
					p->color = rblue4;
			}
			else 
			{
				p->color = color1;
			}

			if (lencount <= 0)
			{
				segment++;
				if (segment < trail.Size())
				{
					pos = trail[segment].start - trail[segment].dir * lencount;
					lencount += trail[segment].length;
				}
				else
				{
					// should never happen but if something goes wrong, just terminate the loop.
					break;
				}
			}
		}
	}

	// Create the inner trail.
	if (color2 != -1 && r_rail_trailsparsity > 0 && spawnclass == NULL)
	{
		double stepsize = 3 * r_rail_spiralsparsity * sparsity;
		int trail_steps = xs_FloorToInt(steps * r_rail_trailsparsity / sparsity);

		color2 = color2 == 0 ? -1 : ParticleColor(color2);
		DVector3 diff(0, 0, 0);

		pos = trail[0].start;
		lencount = trail[0].length;
		segment = 0;
		for (i = trail_steps; i; i--)
		{
			// [XA] inner trail uses a different default duration (33).
			int innerduration = (duration == 0) ? 33 : duration;
			particle_t *p = JitterParticle (innerduration, (float)drift);

			if (!p)
				return;

			if (maxdiff > 0)
			{
				int rnd = M_Random ();
				if (rnd & 1)
					diff.X = clamp<double>(diff.X + ((rnd & 8) ? 1 : -1), -maxdiff, maxdiff);
				if (rnd & 2)
					diff.Y = clamp<double>(diff.Y + ((rnd & 16) ? 1 : -1), -maxdiff, maxdiff);
				if (rnd & 4)
					diff.Z = clamp<double>(diff.Z + ((rnd & 32) ? 1 : -1), -maxdiff, maxdiff);
			}

			DVector3 postmp = pos + diff;

			p->size = 2;
			p->Pos = postmp;
			if (color1 != -1)
				p->Acc.Z -= 1./4096;
			pos += trail[segment].dir * stepsize;
			lencount -= stepsize;
			p->bright = fullbright;

			if (color2 == -1)
			{
				int rand = M_Random();

				if (rand < 85)
					p->color = grey4;
				else if (rand < 170)
					p->color = grey2;
				else
					p->color = grey1;
			}
			else 
			{
				p->color = color2;
			}
			if (lencount <= 0)
			{
				segment++;
				if (segment < trail.Size())
				{
					pos = trail[segment].start - trail[segment].dir * lencount;
					lencount += trail[segment].length;
				}
				else
				{
					// should never happen but if something goes wrong, just terminate the loop.
					break;
				}
			}

		}
	}
	// create actors
	if (spawnclass != NULL)
	{
		if (sparsity < 1)
			sparsity = 32;

		double stepsize = 3 * r_rail_spiralsparsity * sparsity;
		int trail_steps = (int)((steps * 3) / sparsity);
		DVector3 diff(0, 0, 0);

		pos = trail[0].start;
		lencount = trail[0].length;
		segment = 0;

		for (i = trail_steps; i; i--)
		{
			if (maxdiff > 0)
			{
				int rnd = pr_railtrail();
				if (rnd & 1)
					diff.X = clamp<double>(diff.X + ((rnd & 8) ? 1 : -1), -maxdiff, maxdiff);
				if (rnd & 2)
					diff.Y = clamp<double>(diff.Y + ((rnd & 16) ? 1 : -1), -maxdiff, maxdiff);
				if (rnd & 4)
					diff.Z = clamp<double>(diff.Z + ((rnd & 32) ? 1 : -1), -maxdiff, maxdiff);
			}			
			AActor *thing = Spawn (spawnclass, pos + diff, ALLOW_REPLACE);
			if (thing)
			{
				if (source)	thing->target = source;
				thing->Angles.Pitch = pitch;
				thing->Angles.Yaw = angle;
			}
			pos += trail[segment].dir * stepsize;
			lencount -= stepsize;
			if (lencount <= 0)
			{
				segment++;
				if (segment < trail.Size())
				{
					pos = trail[segment].start - trail[segment].dir * lencount;
					lencount += trail[segment].length;
				}
				else
				{
					// should never happen but if something goes wrong, just terminate the loop.
					break;
				}
			}
		}
	}
}